

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_11fb896::HandleRegexCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  pointer pbVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  cmExecutionStatus *pcVar8;
  _Alloc_hider _Var9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined8 s;
  char *pcVar14;
  string_view value;
  string_view value_00;
  string_view value_01;
  string output;
  string e_2;
  string input;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  undefined1 local_380 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360 [2];
  cmExecutionStatus *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  pointer local_318;
  string *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  cmStringReplaceHelper local_2e8;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"sub-command REGEX requires a mode to be specified.",
               (allocator<char> *)local_360[0]._M_local_buf);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0038ad0d;
  }
  pbVar13 = pbVar4 + 1;
  bVar12 = std::operator==(pbVar13,"MATCH");
  if (bVar12) {
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x81) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,
                 "sub-command REGEX, mode MATCH needs at least 5 arguments total to command.",
                 (allocator<char> *)local_360[0]._M_local_buf);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0038ad0d;
    }
    psVar1 = pbVar4 + 2;
    cmMakefile::ClearMatches(status->Makefile);
    local_2e8.RegularExpression.regmatch.endp[0x1a] = (char *)0x0;
    local_2e8.RegularExpression.regmatch.endp[0x1c] = (char *)0x0;
    local_2e8.RegularExpression.regmatch.endp[0x1d]._0_4_ = 0;
    memset(&local_2e8,0,0x20a);
    bVar12 = cmsys::RegularExpression::compile((RegularExpression *)&local_2e8,psVar1);
    if (!bVar12) {
      std::operator+(&local_3a0,"sub-command REGEX, mode MATCH failed to compile regex \"",psVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
                     &local_3a0,"\".");
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0038b2c4:
      std::__cxx11::string::~string((string *)local_360[0]._M_local_buf);
      bVar12 = false;
      goto LAB_0038b409;
    }
    local_380._8_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_380._0_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 4;
    paVar2 = &local_3a0.field_2;
    local_3a0._M_string_length = 0;
    local_3a0.field_2._M_local_buf[0] = '\0';
    auVar5._8_8_ = 0;
    auVar5._0_8_ = paVar2;
    local_3a0._M_dataplus._M_p = (pointer)paVar2;
    cmJoin((string *)local_360,(cmStringRange *)local_380,(string_view)(auVar5 << 0x40),
           (string_view)ZEXT816(0));
    std::__cxx11::string::~string((string *)&local_3a0);
    local_3a0._M_string_length = 0;
    local_3a0.field_2._M_local_buf[0] = '\0';
    local_3a0._M_dataplus._M_p = (pointer)paVar2;
    bVar12 = cmsys::RegularExpression::find
                       ((RegularExpression *)&local_2e8,(char *)local_360[0]._0_8_);
    if (bVar12) {
      cmMakefile::StoreMatches(status->Makefile,(RegularExpression *)&local_2e8);
      if (local_2e8.RegularExpression.regmatch.startp[0x18] ==
          local_2e8.ErrorString._M_dataplus._M_p) {
        std::operator+(&local_338,"sub-command REGEX, mode MATCH regex \"",psVar1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_380,&local_338,"\" matched an empty string.");
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)local_380);
        bVar12 = false;
        goto LAB_0038b3f5;
      }
      std::__cxx11::string::substr((ulong)local_380,(ulong)local_360);
      std::__cxx11::string::operator=((string *)&local_3a0,(string *)local_380);
      std::__cxx11::string::~string((string *)local_380);
    }
    bVar12 = true;
    value._M_str = local_3a0._M_dataplus._M_p;
    value._M_len = local_3a0._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,pbVar4 + 3,value);
  }
  else {
    bVar12 = std::operator==(pbVar13,"MATCHALL");
    if (!bVar12) {
      bVar12 = std::operator==(pbVar13,"REPLACE");
      if (!bVar12) {
        std::operator+(&local_2e8.ErrorString,"sub-command REGEX does not recognize mode ",pbVar13);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0038ad0d:
        std::__cxx11::string::~string((string *)&local_2e8);
        return false;
      }
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0xc0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e8,
                   "sub-command REGEX, mode REPLACE needs at least 6 arguments total to command.",
                   (allocator<char> *)local_360[0]._M_local_buf);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0038ad0d;
      }
      std::__cxx11::string::string((string *)local_360[0]._M_local_buf,(string *)(pbVar4 + 3));
      cmStringReplaceHelper::cmStringReplaceHelper
                (&local_2e8,pbVar4 + 2,(string *)local_360,status->Makefile);
      std::__cxx11::string::~string((string *)local_360[0]._M_local_buf);
      if (local_2e8.ValidReplaceExpression == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_380,"sub-command REGEX, mode REPLACE: ",&local_2e8.ErrorString);
        std::operator+(&local_3a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_380,".");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&local_3a0);
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380;
      }
      else {
        cmMakefile::ClearMatches(status->Makefile);
        if (local_2e8.RegularExpression.program != (char *)0x0) {
          local_338._M_string_length =
               (size_type)
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_338._M_dataplus._M_p =
               (pointer)((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 5);
          pbVar3 = (pointer)(local_380 + 0x10);
          local_380._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_380[0x10] = '\0';
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pbVar3;
          local_380._0_8_ = pbVar3;
          cmJoin(&local_3a0,(cmStringRange *)&local_338,(string_view)(auVar7 << 0x40),
                 (string_view)ZEXT816(0));
          std::__cxx11::string::~string((string *)local_380);
          local_380._8_8_ = (pointer)0x0;
          local_380[0x10] = '\0';
          local_380._0_8_ = pbVar3;
          bVar12 = cmStringReplaceHelper::Replace(&local_2e8,&local_3a0,(string *)local_380);
          if (bVar12) {
            value_00._M_str = (char *)local_380._0_8_;
            value_00._M_len = local_380._8_8_;
            cmMakefile::AddDefinition(status->Makefile,pbVar4 + 4,value_00);
          }
          else {
            std::operator+(&local_308,"sub-command REGEX, mode REPLACE: ",&local_2e8.ErrorString);
            std::operator+(&local_338,&local_308,".");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            std::__cxx11::string::~string((string *)&local_338);
            std::__cxx11::string::~string((string *)&local_308);
          }
          std::__cxx11::string::~string((string *)local_380);
          std::__cxx11::string::~string((string *)&local_3a0);
          goto LAB_0038b4df;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_380,"sub-command REGEX, mode REPLACE failed to compile regex \"",
                       pbVar4 + 2);
        std::operator+(&local_3a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_380,"\".");
        std::__cxx11::string::~string((string *)local_380);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        pbVar13 = &local_3a0;
      }
      std::__cxx11::string::~string((string *)pbVar13);
      bVar12 = false;
LAB_0038b4df:
      cmStringReplaceHelper::~cmStringReplaceHelper(&local_2e8);
      return bVar12;
    }
    local_318 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)local_318) < 0x81) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,
                 "sub-command REGEX, mode MATCHALL needs at least 5 arguments total to command.",
                 (allocator<char> *)local_360[0]._M_local_buf);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0038ad0d;
    }
    psVar1 = local_318 + 2;
    cmMakefile::ClearMatches(status->Makefile);
    local_2e8.RegularExpression.regmatch.endp[0x1a] = (char *)0x0;
    local_2e8.RegularExpression.regmatch.endp[0x1c] = (char *)0x0;
    local_2e8.RegularExpression.regmatch.endp[0x1d]._0_4_ = 0;
    memset(&local_2e8,0,0x20a);
    bVar12 = cmsys::RegularExpression::compile((RegularExpression *)&local_2e8,psVar1);
    if (!bVar12) {
      std::operator+(&local_3a0,"sub-command REGEX, mode MATCHALL failed to compile regex \"",psVar1
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
                     &local_3a0,"\".");
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0038b2c4;
    }
    local_380._8_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_380._0_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 4;
    paVar2 = &local_3a0.field_2;
    local_3a0._M_string_length = 0;
    local_3a0.field_2._M_local_buf[0] = '\0';
    auVar6._8_8_ = 0;
    auVar6._0_8_ = paVar2;
    local_3a0._M_dataplus._M_p = (pointer)paVar2;
    local_340 = status;
    local_310 = psVar1;
    cmJoin((string *)local_360,(cmStringRange *)local_380,(string_view)(auVar6 << 0x40),
           (string_view)ZEXT816(0));
    local_318 = local_318 + 3;
    std::__cxx11::string::~string((string *)&local_3a0);
    local_3a0._M_string_length = 0;
    local_3a0.field_2._M_local_buf[0] = '\0';
    s = local_360[0]._M_allocated_capacity;
    local_3a0._M_dataplus._M_p = (pointer)paVar2;
    while( true ) {
      bVar12 = cmsys::RegularExpression::find((RegularExpression *)&local_2e8,(char *)s);
      if (!bVar12) break;
      cmMakefile::ClearMatches(local_340->Makefile);
      cmMakefile::StoreMatches(local_340->Makefile,(RegularExpression *)&local_2e8);
      pcVar11 = local_2e8.RegularExpression.regmatch.endp[0x18];
      pcVar10 = local_2e8.RegularExpression.regmatch.startp[0x18];
      _Var9._M_p = local_2e8.ErrorString._M_dataplus._M_p;
      if (local_2e8.RegularExpression.regmatch.startp[0x18] ==
          local_2e8.ErrorString._M_dataplus._M_p) {
        std::operator+(&local_338,"sub-command REGEX, mode MATCHALL regex \"",local_310);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_380,&local_338,"\" matched an empty string.");
        pcVar8 = local_340;
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::_M_assign((string *)&pcVar8->Error);
        std::__cxx11::string::~string((string *)local_380);
        goto LAB_0038b39e;
      }
      if (local_3a0._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_3a0);
      }
      pcVar14 = (char *)(s + ((long)_Var9._M_p - (long)pcVar11));
      local_380._0_8_ = local_380 + 0x10;
      s = s + ((long)pcVar10 - (long)pcVar11);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,pcVar14,s);
      std::__cxx11::string::append((string *)&local_3a0);
      std::__cxx11::string::~string((string *)local_380);
    }
    value_01._M_str = local_3a0._M_dataplus._M_p;
    value_01._M_len = local_3a0._M_string_length;
    cmMakefile::AddDefinition(local_340->Makefile,local_318,value_01);
LAB_0038b39e:
    bVar12 = !bVar12;
  }
LAB_0038b3f5:
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)local_360[0]._M_local_buf);
LAB_0038b409:
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&local_2e8);
  return bVar12;
}

Assistant:

bool HandleRegexCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command REGEX requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if (mode == "MATCH") {
    if (args.size() < 5) {
      status.SetError("sub-command REGEX, mode MATCH needs "
                      "at least 5 arguments total to command.");
      return false;
    }
    return RegexMatch(args, status);
  }
  if (mode == "MATCHALL") {
    if (args.size() < 5) {
      status.SetError("sub-command REGEX, mode MATCHALL needs "
                      "at least 5 arguments total to command.");
      return false;
    }
    return RegexMatchAll(args, status);
  }
  if (mode == "REPLACE") {
    if (args.size() < 6) {
      status.SetError("sub-command REGEX, mode REPLACE needs "
                      "at least 6 arguments total to command.");
      return false;
    }
    return RegexReplace(args, status);
  }

  std::string e = "sub-command REGEX does not recognize mode " + mode;
  status.SetError(e);
  return false;
}